

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O3

void AVSInterface::RegisterFilter<LegacyMiniDeen>(IScriptEnvironment *env)

{
  string local_e0;
  Filter local_c0;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined1 local_20;
  
  local_c0.in_vi.Format.IsFamilyYUV = true;
  local_c0.in_vi.Format.IsFamilyRGB = false;
  local_c0.in_vi.Format.IsFamilyYCC = false;
  local_c0.in_vi.Format.IsInteger = true;
  local_c0.in_vi.Format.IsFloat = false;
  local_c0.in_vi.Format.SSW = 0;
  local_c0.in_vi.Format.SSH = 0;
  local_c0.in_vi.Format.BitsPerSample = 8;
  local_c0.in_vi.Format.BytesPerSample = 1;
  local_c0.in_vi.Format.Planes = 3;
  local_c0.in_vi.FPSNum = 1;
  local_c0.in_vi.FPSDenom = 1;
  local_c0.in_vi.Width = 0;
  local_c0.in_vi.Height = 0;
  local_c0.in_vi.Frames = 0;
  local_c0.in_vi.Audio_SPS = 0;
  local_c0.in_vi.Audio_SType = 0;
  local_c0.in_vi.Audio_NSamples = 0;
  local_c0.in_vi.Audio_NChannels = 0;
  local_c0.in_vi.Field = 0;
  local_58 = 0x200000002;
  uStack_50 = 0x200000002;
  local_48 = 0xc0000000a;
  uStack_40 = 0x10000000c;
  local_38 = 0x100000001;
  local_30 = 0;
  local_20 = 1;
  local_c0._vptr_Filter = (_func_int **)&PTR_VSName_00116c10;
  Filter::AVSParams_abi_cxx11_(&local_e0,&local_c0);
  (**(code **)(*(long *)env + 0x38))
            (env,"minideen",local_e0._M_dataplus._M_p,Create<LegacyMiniDeen>,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RegisterFilter(IScriptEnvironment* env) {
    FilterType filter;
    env->AddFunction(filter.AVSName(), filter.AVSParams().c_str(), Create<FilterType>, nullptr);
  }